

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O3

size_t license::mstrnlen_s(char *szptr,size_t maxsize)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  if ((szptr != (char *)0x0) && (maxsize != 0 && *szptr != '\0')) {
    sVar2 = 0;
    do {
      sVar1 = sVar2 + 1;
      if (szptr[sVar2 + 1] == '\0') {
        return sVar1;
      }
      bVar3 = maxsize - 1 != sVar2;
      sVar2 = sVar2 + 1;
    } while (bVar3);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t mstrnlen_s(const char *szptr, size_t maxsize) {
	if (szptr == nullptr) {
		return 0;
	}
	size_t count = 0;
	while (*szptr++ && maxsize--) {
		count++;
	}
	return count;
}